

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

void j2k_read_sot(opj_j2k_t *j2k)

{
  int *piVar1;
  opj_cp_t *poVar2;
  opj_cio_t *cio;
  opj_tile_info_t *poVar3;
  opj_tccp_t *poVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint *puVar10;
  uchar *puVar11;
  opj_tp_info_t *poVar12;
  ulong uVar13;
  size_t __size;
  opj_tcp_t *__dest;
  long lVar14;
  
  poVar2 = j2k->cp;
  cio = j2k->cio;
  cio_read(cio,2);
  uVar5 = cio_read(cio,2);
  uVar6 = poVar2->tileno_size;
  if ((ulong)uVar6 == 0) {
    puVar10 = (uint *)poVar2->tileno;
  }
  else {
    if (0 < (int)uVar6) {
      uVar13 = 1;
      do {
        lVar14 = uVar13 - 1;
        if (uVar6 <= uVar13) break;
        uVar13 = uVar13 + 1;
      } while (poVar2->tileno[lVar14] != uVar5);
      if (poVar2->tileno[lVar14] == uVar5) goto LAB_00123c14;
    }
    puVar10 = (uint *)(poVar2->tileno + (int)uVar6);
  }
  *puVar10 = uVar5;
  poVar2->tileno_size = poVar2->tileno_size + 1;
LAB_00123c14:
  uVar6 = cio_read(cio,4);
  if (uVar6 == 0) {
    iVar7 = cio_numbytesleft(cio);
    uVar6 = iVar7 + 8;
  }
  uVar8 = cio_read(cio,1);
  uVar9 = cio_read(cio,1);
  if ((int)uVar9 <= (int)uVar8) {
    opj_event_msg(j2k->cinfo,2,
                  "SOT marker inconsistency in tile %d: tile-part index greater (%d) than number of tile-parts (%d)\n"
                  ,(ulong)uVar5,(ulong)uVar8,(ulong)uVar9);
    uVar9 = uVar8 + 1;
  }
  j2k->curtileno = uVar5;
  j2k->cur_tp_num = uVar8;
  puVar11 = cio_getbp(cio);
  j2k->eot = puVar11 + (long)(int)uVar6 + -0xc;
  j2k->state = 0x10;
  __dest = poVar2->tcps + j2k->curtileno;
  if (j2k->cstr_info != (opj_codestream_info_t *)0x0) {
    if (__dest->first == 0) {
      piVar1 = &j2k->cstr_info->tile[(int)uVar5].end_pos;
      *piVar1 = *piVar1 + uVar6;
    }
    else {
      if (uVar5 == 0) {
        iVar7 = cio_tell(cio);
        j2k->cstr_info->main_head_end = iVar7 + -0xd;
      }
      j2k->cstr_info->tile[(int)uVar5].tileno = uVar5;
      iVar7 = cio_tell(cio);
      poVar3 = j2k->cstr_info->tile;
      poVar3[(int)uVar5].start_pos = iVar7 + -0xc;
      poVar3[(int)uVar5].end_pos = iVar7 + uVar6 + -0xd;
    }
    poVar3 = j2k->cstr_info->tile;
    poVar3[(int)uVar5].num_tps = uVar9;
    if (uVar9 == 0) {
      __size = 200;
    }
    else {
      __size = (long)(int)uVar9 * 0x14;
    }
    poVar12 = (opj_tp_info_t *)realloc(poVar3[(int)uVar5].tp,__size);
    j2k->cstr_info->tile[(int)uVar5].tp = poVar12;
    iVar7 = cio_tell(cio);
    poVar12 = j2k->cstr_info->tile[(int)uVar5].tp;
    poVar12[(int)uVar8].tp_start_pos = iVar7 + -0xc;
    poVar12[(int)uVar8].tp_end_pos = iVar7 + uVar6 + -0xd;
  }
  if (__dest->first == 1) {
    poVar4 = __dest->tccps;
    memcpy(__dest,j2k->default_tcp,0x15e8);
    __dest->ppt_data = (uchar *)0x0;
    __dest->ppt_data_first = (uchar *)0x0;
    __dest->ppt = 0;
    __dest->tccps = poVar4;
    if (j2k->image->numcomps != 0) {
      lVar14 = 0;
      uVar13 = 0;
      do {
        memcpy((void *)((long)__dest->tccps->stepsizes + lVar14 + -0x1c),
               (void *)((long)j2k->default_tcp->tccps->stepsizes + lVar14 + -0x1c),0x438);
        uVar13 = uVar13 + 1;
        lVar14 = lVar14 + 0x438;
      } while (uVar13 < j2k->image->numcomps);
    }
    poVar2->tcps[j2k->curtileno].first = 0;
  }
  return;
}

Assistant:

static void j2k_read_sot(opj_j2k_t *j2k) {
	int len, tileno, totlen, partno, numparts, i;
	opj_tcp_t *tcp = NULL;
	char status = 0;

	opj_cp_t *cp = j2k->cp;
	opj_cio_t *cio = j2k->cio;

	len = cio_read(cio, 2);
	tileno = cio_read(cio, 2);

#ifdef USE_JPWL
	if (j2k->cp->correct) {

		static int backup_tileno = 0;

		/* tileno is negative or larger than the number of tiles!!! */
		if ((tileno < 0) || (tileno > (cp->tw * cp->th))) {
			opj_event_msg(j2k->cinfo, EVT_ERROR,
				"JPWL: bad tile number (%d out of a maximum of %d)\n",
				tileno, (cp->tw * cp->th));
			if (!JPWL_ASSUME) {
				opj_event_msg(j2k->cinfo, EVT_ERROR, "JPWL: giving up\n");
				return;
			}
			/* we try to correct */
			tileno = backup_tileno;
			opj_event_msg(j2k->cinfo, EVT_WARNING, "- trying to adjust this\n"
				"- setting tile number to %d\n",
				tileno);
		}

		/* keep your private count of tiles */
		backup_tileno++;
	};
#endif /* USE_JPWL */
	
	if (cp->tileno_size == 0) {
		cp->tileno[cp->tileno_size] = tileno;
		cp->tileno_size++;
	} else {
		i = 0;
		while (i < cp->tileno_size && status == 0) {
			status = cp->tileno[i] == tileno ? 1 : 0;
			i++;
		}
		if (status == 0) {
			cp->tileno[cp->tileno_size] = tileno;
			cp->tileno_size++;
		}
	}
	
	totlen = cio_read(cio, 4);

#ifdef USE_JPWL
	if (j2k->cp->correct) {

		/* totlen is negative or larger than the bytes left!!! */
		if ((totlen < 0) || (totlen > (cio_numbytesleft(cio) + 8))) {
			opj_event_msg(j2k->cinfo, EVT_ERROR,
				"JPWL: bad tile byte size (%d bytes against %d bytes left)\n",
				totlen, cio_numbytesleft(cio) + 8);
			if (!JPWL_ASSUME) {
				opj_event_msg(j2k->cinfo, EVT_ERROR, "JPWL: giving up\n");
				return;
			}
			/* we try to correct */
			totlen = 0;
			opj_event_msg(j2k->cinfo, EVT_WARNING, "- trying to adjust this\n"
				"- setting Psot to %d => assuming it is the last tile\n",
				totlen);
		}

	};
#endif /* USE_JPWL */

	if (!totlen)
		totlen = cio_numbytesleft(cio) + 8;
	
	partno = cio_read(cio, 1);
	numparts = cio_read(cio, 1);
  
  if (partno >= numparts) {
    opj_event_msg(j2k->cinfo, EVT_WARNING, "SOT marker inconsistency in tile %d: tile-part index greater (%d) than number of tile-parts (%d)\n", tileno, partno, numparts);
    numparts = partno+1;
  }
	
	j2k->curtileno = tileno;
	j2k->cur_tp_num = partno;
	j2k->eot = cio_getbp(cio) - 12 + totlen;
	j2k->state = J2K_STATE_TPH;
	tcp = &cp->tcps[j2k->curtileno];

	/* Index */
	if (j2k->cstr_info) {
		if (tcp->first) {
			if (tileno == 0) 
				j2k->cstr_info->main_head_end = cio_tell(cio) - 13;
			j2k->cstr_info->tile[tileno].tileno = tileno;
			j2k->cstr_info->tile[tileno].start_pos = cio_tell(cio) - 12;
			j2k->cstr_info->tile[tileno].end_pos = j2k->cstr_info->tile[tileno].start_pos + totlen - 1;				
    } else {
			j2k->cstr_info->tile[tileno].end_pos += totlen;
		}
    j2k->cstr_info->tile[tileno].num_tps = numparts;
    if (numparts)
      j2k->cstr_info->tile[tileno].tp = (opj_tp_info_t *) opj_realloc(j2k->cstr_info->tile[tileno].tp, numparts * sizeof(opj_tp_info_t));
    else
      j2k->cstr_info->tile[tileno].tp = (opj_tp_info_t *) opj_realloc(j2k->cstr_info->tile[tileno].tp, 10 * sizeof(opj_tp_info_t)); /* Fixme (10)*/
		j2k->cstr_info->tile[tileno].tp[partno].tp_start_pos = cio_tell(cio) - 12;
		j2k->cstr_info->tile[tileno].tp[partno].tp_end_pos = 
			j2k->cstr_info->tile[tileno].tp[partno].tp_start_pos + totlen - 1;
	}
	
	if (tcp->first == 1) {		
		/* Initialization PPT */
		opj_tccp_t *tmp = tcp->tccps;
		memcpy(tcp, j2k->default_tcp, sizeof(opj_tcp_t));
		tcp->ppt = 0;
		tcp->ppt_data = NULL;
		tcp->ppt_data_first = NULL;
		tcp->tccps = tmp;

		for (i = 0; i < j2k->image->numcomps; i++) {
			tcp->tccps[i] = j2k->default_tcp->tccps[i];
		}
		cp->tcps[j2k->curtileno].first = 0;
	}
}